

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O3

bool __thiscall ProStringList::contains(ProStringList *this,char *str,CaseSensitivity cs)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  
  if ((this->super_QList<ProString>).d.size == 0) {
    return false;
  }
  lVar2 = 0;
  uVar3 = 0;
  do {
    iVar1 = ProString::compare((ProString *)
                               ((long)&(((this->super_QList<ProString>).d.ptr)->m_string).d.d +
                               lVar2),str,cs);
    bVar4 = iVar1 == 0;
    if (bVar4) {
      return bVar4;
    }
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x30;
  } while (uVar3 < (ulong)(this->super_QList<ProString>).d.size);
  return bVar4;
}

Assistant:

bool ProStringList::contains(const char *str, Qt::CaseSensitivity cs) const
{
    for (int i = 0; i < size(); i++)
        if (!at(i).compare(str, cs))
            return true;
    return false;
}